

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void last_insert_rowid(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  sqlite3 *db_00;
  sqlite3_int64 iVal;
  sqlite3 *db;
  sqlite3_value **NotUsed2_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  iVal = sqlite3_last_insert_rowid(db_00);
  sqlite3_result_int64(context,iVal);
  return;
}

Assistant:

static void last_insert_rowid(
  sqlite3_context *context, 
  int NotUsed, 
  sqlite3_value **NotUsed2
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  /* IMP: R-51513-12026 The last_insert_rowid() SQL function is a
  ** wrapper around the sqlite3_last_insert_rowid() C/C++ interface
  ** function. */
  sqlite3_result_int64(context, sqlite3_last_insert_rowid(db));
}